

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int lpack(lua_State *L)

{
  uint uVar1;
  void *srcv;
  void *pvVar2;
  lua_Integer lVar3;
  int osz;
  int bytes;
  void *output;
  size_t maxsz;
  void *buffer;
  size_t sz;
  lua_State *L_local;
  
  buffer = (void *)0x0;
  sz = (size_t)L;
  srcv = getbuffer(L,1,(size_t *)&buffer);
  pvVar2 = (void *)(((long)buffer + 0x7ffU >> 0xb) * 2 + (long)buffer);
  _osz = (char *)lua_touserdata((lua_State *)sz,-0xf4629);
  lVar3 = lua_tointegerx((lua_State *)sz,-0xf462a,(int *)0x0);
  if ((void *)(long)(int)lVar3 < pvVar2) {
    _osz = (char *)expand_buffer((lua_State *)sz,(int)lVar3,(int)pvVar2);
  }
  uVar1 = sproto_pack(srcv,(int)buffer,_osz,(int)pvVar2);
  if (pvVar2 < (void *)(long)(int)uVar1) {
    L_local._4_4_ = luaL_error((lua_State *)sz,"packing error, return size = %d",(ulong)uVar1);
  }
  else {
    lua_pushlstring((lua_State *)sz,_osz,(long)(int)uVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
lpack(lua_State *L) {
	size_t sz=0;
	const void * buffer = getbuffer(L, 1, &sz);
	// the worst-case space overhead of packing is 2 bytes per 2 KiB of input (256 words = 2KiB).
	size_t maxsz = (sz + 2047) / 2048 * 2 + sz;
	void * output = lua_touserdata(L, lua_upvalueindex(1));
	int bytes;
	int osz = lua_tointeger(L, lua_upvalueindex(2));
	if (osz < maxsz) {
		output = expand_buffer(L, osz, maxsz);
	}
	bytes = sproto_pack(buffer, sz, output, maxsz);
	if (bytes > maxsz) {
		return luaL_error(L, "packing error, return size = %d", bytes);
	}
	lua_pushlstring(L, output, bytes);

	return 1;
}